

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStorage.cpp
# Opt level: O3

int __thiscall OpenMD::DataStorage::copy(DataStorage *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  uint uVar1;
  pointer pSVar2;
  pointer pdVar3;
  pointer pdVar4;
  void *pvVar5;
  size_t in_RCX;
  size_t sVar6;
  difference_type __d_1;
  int source;
  difference_type __d;
  
  uVar1 = this->storageLayout_;
  source = (int)dst;
  if ((uVar1 & 1) != 0) {
    internalCopy<OpenMD::Vector3<double>>(this,&this->position,source,(size_t)src,in_RCX);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 & 2) != 0) {
    internalCopy<OpenMD::Vector3<double>>(this,&this->velocity,source,(size_t)src,in_RCX);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 & 4) != 0) {
    internalCopy<OpenMD::Vector3<double>>(this,&this->force,source,(size_t)src,in_RCX);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 & 8) != 0) {
    pSVar2 = (this->aMat).
             super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<OpenMD::SquareMatrix3<double>*,OpenMD::SquareMatrix3<double>*>
              (pSVar2 + source,pSVar2 + (long)(src + 1),pSVar2 + in_RCX);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 & 0x10) != 0) {
    internalCopy<OpenMD::Vector3<double>>(this,&this->angularMomentum,source,(size_t)src,in_RCX);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 & 0x20) != 0) {
    internalCopy<OpenMD::Vector3<double>>(this,&this->torque,source,(size_t)src,in_RCX);
    uVar1 = this->storageLayout_;
  }
  pdVar4 = (pointer)(ulong)uVar1;
  if ((uVar1 & 0x40) != 0) {
    pdVar3 = (this->particlePot).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar6 = (long)pdVar3 + (((long)src * 8 + 8) - (long)(pdVar3 + source));
    if (sVar6 != 0) {
      memmove(pdVar3 + in_RCX,pdVar3 + source,sVar6);
      pdVar4 = (pointer)(ulong)(uint)this->storageLayout_;
    }
  }
  if ((char)pdVar4 < '\0') {
    pdVar3 = (this->density).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar6 = (long)pdVar3 + (((long)src * 8 + 8) - (long)(pdVar3 + source));
    if (sVar6 != 0) {
      memmove(pdVar3 + in_RCX,pdVar3 + source,sVar6);
      pdVar4 = (pointer)(ulong)(uint)this->storageLayout_;
    }
  }
  if (((uint)pdVar4 >> 8 & 1) != 0) {
    pdVar3 = (this->functional).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar6 = (long)pdVar3 + (((long)src * 8 + 8) - (long)(pdVar3 + source));
    if (sVar6 != 0) {
      memmove(pdVar3 + in_RCX,pdVar3 + source,sVar6);
      pdVar4 = (pointer)(ulong)(uint)this->storageLayout_;
    }
  }
  if (((uint)pdVar4 >> 9 & 1) != 0) {
    pdVar3 = (this->functionalDerivative).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    sVar6 = (long)pdVar3 + (((long)src * 8 + 8) - (long)(pdVar3 + source));
    if (sVar6 != 0) {
      memmove(pdVar3 + in_RCX,pdVar3 + source,sVar6);
      pdVar4 = (pointer)(ulong)(uint)this->storageLayout_;
    }
  }
  if (((uint)pdVar4 >> 10 & 1) != 0) {
    internalCopy<OpenMD::Vector3<double>>(this,&this->dipole,source,(size_t)src,in_RCX);
    pdVar4 = (pointer)(ulong)(uint)this->storageLayout_;
  }
  if (((uint)pdVar4 >> 0xb & 1) != 0) {
    pSVar2 = (this->quadrupole).
             super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<OpenMD::SquareMatrix3<double>*,OpenMD::SquareMatrix3<double>*>
              (pSVar2 + source,pSVar2 + (long)(src + 1),pSVar2 + in_RCX);
    pdVar4 = (pointer)(ulong)(uint)this->storageLayout_;
  }
  if (((uint)pdVar4 >> 0xc & 1) != 0) {
    internalCopy<OpenMD::Vector3<double>>(this,&this->electricField,source,(size_t)src,in_RCX);
    pdVar4 = (pointer)(ulong)(uint)this->storageLayout_;
  }
  if (((uint)pdVar4 >> 0xd & 1) != 0) {
    pdVar3 = (this->skippedCharge).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar6 = (long)pdVar3 + (((long)src * 8 + 8) - (long)(pdVar3 + source));
    if (sVar6 != 0) {
      memmove(pdVar3 + in_RCX,pdVar3 + source,sVar6);
      pdVar4 = (pointer)(ulong)(uint)this->storageLayout_;
    }
  }
  if (((uint)pdVar4 >> 0xe & 1) != 0) {
    pdVar3 = (this->flucQPos).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar6 = (long)pdVar3 + (((long)src * 8 + 8) - (long)(pdVar3 + source));
    if (sVar6 != 0) {
      memmove(pdVar3 + in_RCX,pdVar3 + source,sVar6);
      pdVar4 = (pointer)(ulong)(uint)this->storageLayout_;
    }
  }
  if ((short)pdVar4 < 0) {
    pdVar3 = (this->flucQVel).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar6 = (long)pdVar3 + (((long)src * 8 + 8) - (long)(pdVar3 + source));
    if (sVar6 != 0) {
      memmove(pdVar3 + in_RCX,pdVar3 + source,sVar6);
      pdVar4 = (pointer)(ulong)(uint)this->storageLayout_;
    }
  }
  if (((uint)pdVar4 >> 0x10 & 1) != 0) {
    pdVar3 = (this->flucQFrc).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar6 = (long)pdVar3 + (((long)src * 8 + 8) - (long)(pdVar3 + source));
    if (sVar6 != 0) {
      memmove(pdVar3 + in_RCX,pdVar3 + source,sVar6);
      pdVar4 = (pointer)(ulong)(uint)this->storageLayout_;
    }
  }
  if (((uint)pdVar4 >> 0x11 & 1) != 0) {
    pdVar4 = (this->sitePotential).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar6 = (long)pdVar4 + (((long)src * 8 + 8) - (long)(pdVar4 + source));
    if (sVar6 != 0) {
      pvVar5 = memmove(pdVar4 + in_RCX,pdVar4 + source,sVar6);
      return (int)pvVar5;
    }
  }
  return (int)pdVar4;
}

Assistant:

void DataStorage::copy(int source, std::size_t num, std::size_t target) {
    if (num + target > size_) {
      // error
    }

    if (storageLayout_ & dslPosition) {
      internalCopy(position, source, num, target);
    }

    if (storageLayout_ & dslVelocity) {
      internalCopy(velocity, source, num, target);
    }

    if (storageLayout_ & dslForce) { internalCopy(force, source, num, target); }

    if (storageLayout_ & dslAmat) { internalCopy(aMat, source, num, target); }

    if (storageLayout_ & dslAngularMomentum) {
      internalCopy(angularMomentum, source, num, target);
    }

    if (storageLayout_ & dslTorque) {
      internalCopy(torque, source, num, target);
    }

    if (storageLayout_ & dslParticlePot) {
      internalCopy(particlePot, source, num, target);
    }

    if (storageLayout_ & dslDensity) {
      internalCopy(density, source, num, target);
    }

    if (storageLayout_ & dslFunctional) {
      internalCopy(functional, source, num, target);
    }

    if (storageLayout_ & dslFunctionalDerivative) {
      internalCopy(functionalDerivative, source, num, target);
    }

    if (storageLayout_ & dslDipole) {
      internalCopy(dipole, source, num, target);
    }

    if (storageLayout_ & dslQuadrupole) {
      internalCopy(quadrupole, source, num, target);
    }

    if (storageLayout_ & dslElectricField) {
      internalCopy(electricField, source, num, target);
    }

    if (storageLayout_ & dslSkippedCharge) {
      internalCopy(skippedCharge, source, num, target);
    }

    if (storageLayout_ & dslFlucQPosition) {
      internalCopy(flucQPos, source, num, target);
    }

    if (storageLayout_ & dslFlucQVelocity) {
      internalCopy(flucQVel, source, num, target);
    }
    if (storageLayout_ & dslFlucQForce) {
      internalCopy(flucQFrc, source, num, target);
    }

    if (storageLayout_ & dslSitePotential) {
      internalCopy(sitePotential, source, num, target);
    }
  }